

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::Test::IsSkipped(void)

{
  bool bVar1;
  UnitTestImpl *this;
  TestResult *unaff_retaddr;
  
  this = internal::GetUnitTestImpl();
  internal::UnitTestImpl::current_test_result(this);
  bVar1 = TestResult::Skipped(unaff_retaddr);
  return bVar1;
}

Assistant:

bool Test::IsSkipped() {
  return internal::GetUnitTestImpl()->current_test_result()->Skipped();
}